

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# intervals.cpp
# Opt level: O1

void __thiscall
IntervalsTest_TestOverlapOuterNested_Test::TestBody(IntervalsTest_TestOverlapOuterNested_Test *this)

{
  void *pvVar1;
  char *message;
  initializer_list<int> __l;
  void *pvStack_78;
  vector<wasm::Interval,_std::allocator<wasm::Interval>_> intervals;
  undefined1 local_58 [8];
  vector<int,_std::allocator<int>_> expected;
  vector<int,_std::allocator<int>_> local_38;
  int local_20 [2];
  AssertionResult gtest_ar;
  
  pvStack_78 = (void *)0x0;
  intervals.super__Vector_base<wasm::Interval,_std::allocator<wasm::Interval>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  intervals.super__Vector_base<wasm::Interval,_std::allocator<wasm::Interval>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_58._0_4_ = 0;
  local_38.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start.
  _0_4_ = 3;
  local_20[0] = 6;
  std::vector<wasm::Interval,std::allocator<wasm::Interval>>::emplace_back<int,int,int>
            ((vector<wasm::Interval,std::allocator<wasm::Interval>> *)&pvStack_78,(int *)local_58,
             (int *)&local_38,local_20);
  local_58._0_4_ = 4;
  local_38.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start.
  _0_4_ = 0xb;
  local_20[0] = 1;
  std::vector<wasm::Interval,std::allocator<wasm::Interval>>::emplace_back<int,int,int>
            ((vector<wasm::Interval,std::allocator<wasm::Interval>> *)&pvStack_78,(int *)local_58,
             (int *)&local_38,local_20);
  local_58._0_4_ = 0xc;
  local_38.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start.
  _0_4_ = 0x12;
  local_20[0] = 3;
  std::vector<wasm::Interval,std::allocator<wasm::Interval>>::emplace_back<int,int,int>
            ((vector<wasm::Interval,std::allocator<wasm::Interval>> *)&pvStack_78,(int *)local_58,
             (int *)&local_38,local_20);
  local_58._0_4_ = 2;
  local_38.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start =
       (pointer)CONCAT44(local_38.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                         super__Vector_impl_data._M_start._4_4_,0xf);
  local_20[0] = 6;
  std::vector<wasm::Interval,std::allocator<wasm::Interval>>::emplace_back<int,int,int>
            ((vector<wasm::Interval,std::allocator<wasm::Interval>> *)&pvStack_78,(int *)local_58,
             (int *)&local_38,local_20);
  local_38.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start =
       (pointer)0x100000000;
  local_38.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_finish.
  _0_4_ = 2;
  __l._M_len = 3;
  __l._M_array = (iterator)&local_38;
  std::vector<int,_std::allocator<int>_>::vector
            ((vector<int,_std::allocator<int>_> *)local_58,__l,(allocator_type *)local_20);
  ::wasm::IntervalProcessor::filterOverlaps((vector *)&local_38);
  testing::internal::
  CmpHelperEQ<std::vector<int,std::allocator<int>>,std::vector<int,std::allocator<int>>>
            ((internal *)local_20,"IntervalProcessor::filterOverlaps(intervals)","expected",
             &local_38,(vector<int,_std::allocator<int>_> *)local_58);
  if ((long *)local_38.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data
              ._M_start != (long *)0x0) {
    operator_delete(local_38.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_38.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_38.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  if (local_20[0]._0_1_ == (allocator_type)0x0) {
    testing::Message::Message((Message *)&local_38);
    if (gtest_ar._0_8_ == 0) {
      message = "";
    }
    else {
      message = *(char **)gtest_ar._0_8_;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)
               &expected.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage,kFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/test/gtest/intervals.cpp"
               ,0x5e,message);
    testing::internal::AssertHelper::operator=
              ((AssertHelper *)
               &expected.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage,(Message *)&local_38);
    testing::internal::AssertHelper::~AssertHelper
              ((AssertHelper *)
               &expected.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage);
    if ((long *)local_38.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                super__Vector_impl_data._M_start != (long *)0x0) {
      (**(code **)(*(long *)local_38.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                            super__Vector_impl_data._M_start + 8))();
    }
  }
  if (gtest_ar._0_8_ != 0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&gtest_ar,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)gtest_ar._0_8_
                );
  }
  pvVar1 = (void *)CONCAT44(local_58._4_4_,local_58._0_4_);
  if (pvVar1 != (void *)0x0) {
    operator_delete(pvVar1,(long)expected.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                 super__Vector_impl_data._M_finish - (long)pvVar1);
  }
  if (pvStack_78 != (void *)0x0) {
    operator_delete(pvStack_78,
                    (long)intervals.
                          super__Vector_base<wasm::Interval,_std::allocator<wasm::Interval>_>.
                          _M_impl.super__Vector_impl_data._M_finish - (long)pvStack_78);
  }
  return;
}

Assistant:

TEST(IntervalsTest, TestOverlapOuterNested) {
  std::vector<Interval> intervals;
  intervals.emplace_back(0, 3, 6);
  intervals.emplace_back(4, 11, 1);
  intervals.emplace_back(12, 18, 3);
  intervals.emplace_back(2, 15, 6);
  std::vector<int> expected{0, 1, 2};
  ASSERT_EQ(IntervalProcessor::filterOverlaps(intervals), expected);
}